

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test::
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test
           *this)

{
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test
  *this_local;
  
  memset(this,0,0x10);
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode::
  TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).super_Utest.
  _vptr_Utest = (_func_int **)
                &
                PTR__TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_Test_00401638
  ;
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeNewByTemporarlySwitchingOffNew)
{
#ifdef CPPUTEST_USE_NEW_MACROS
    #undef new
    #undef delete
#endif
    char* memory = new char[10];
    delete [] memory;
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}